

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineShape.cpp
# Opt level: O2

void __thiscall
chrono::ChLineShape::ChLineShape(ChLineShape *this,shared_ptr<chrono::geometry::ChLine> *mline)

{
  ChVisualShape::ChVisualShape(&this->super_ChVisualShape);
  (this->super_ChVisualShape)._vptr_ChVisualShape = (_func_int **)&PTR__ChLineShape_0118dd90;
  std::__shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->gline).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>
             ,&mline->super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->npoints = 200;
  return;
}

Assistant:

ChLineShape::ChLineShape(std::shared_ptr<geometry::ChLine>& mline) : npoints(200), gline(mline) {}